

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xor.cpp
# Opt level: O2

void example::learning_xor(void)

{
  longdouble *plVar1;
  longdouble lVar2;
  longdouble lVar3;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 acceptableError_00 [16];
  undefined1 learningRate_00 [16];
  undefined1 adaptiveLearningRate [16];
  undefined1 adaptiveLearningRate_00 [16];
  tensor ppplVar4;
  tensor ppplVar5;
  tensor ppplVar6;
  tensor ppplVar7;
  tensor ppplVar8;
  tensor ppplVar9;
  tensor ppplVar10;
  FullyConnected *pFVar11;
  Loss *pLVar12;
  ostream *poVar13;
  char *__to;
  char *__to_00;
  Layer *pLVar14;
  int i_1;
  int i;
  long lVar15;
  undefined6 in_stack_fffffffffffffe62;
  undefined6 in_stack_fffffffffffffe72;
  tensor in [4];
  tensor out [4];
  SequentialModule moduleB;
  SequentialModule moduleA;
  
  ppplVar4 = type::createTensor(2,1,1);
  in[0] = ppplVar4;
  ppplVar5 = type::createTensor(2,1,1);
  in[1] = ppplVar5;
  ppplVar6 = type::createTensor(2,1,1);
  in[2] = ppplVar6;
  ppplVar7 = type::createTensor(2,1,1);
  in[3] = ppplVar7;
  ppplVar8 = type::createTensor(1,1,1);
  out[0] = ppplVar8;
  ppplVar9 = type::createTensor(1,1,1);
  out[1] = ppplVar9;
  ppplVar10 = type::createTensor(1,1,1);
  out[2] = ppplVar10;
  out[3] = type::createTensor(1,1,1);
  plVar1 = **ppplVar4;
  lVar3 = (longdouble)0;
  *plVar1 = lVar3;
  plVar1[1] = lVar3;
  ***ppplVar8 = lVar3;
  plVar1 = **ppplVar5;
  *plVar1 = lVar3;
  lVar2 = (longdouble)1;
  plVar1[1] = lVar2;
  ***ppplVar9 = lVar2;
  plVar1 = **ppplVar6;
  *plVar1 = lVar2;
  plVar1[1] = lVar3;
  ***ppplVar10 = lVar2;
  plVar1 = **ppplVar7;
  *plVar1 = lVar2;
  plVar1[1] = lVar2;
  ***out[3] = lVar3;
  module::SequentialModule::SequentialModule(&moduleA);
  acceptableError._10_6_ = in_stack_fffffffffffffe62;
  acceptableError._0_10_ = (longdouble)0.001;
  module::SequentialModule::setStopParameter(&moduleA,100,(scalar)acceptableError);
  learningRate._10_6_ = in_stack_fffffffffffffe62;
  learningRate._0_10_ = (longdouble)0.2;
  adaptiveLearningRate._10_6_ = in_stack_fffffffffffffe72;
  adaptiveLearningRate._0_10_ = (longdouble)1e-10;
  module::SequentialModule::setTrainingParameter
            (&moduleA,(scalar)learningRate,(scalar)adaptiveLearningRate);
  module::SequentialModule::setInput(&moduleA,2,1,1);
  pFVar11 = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(pFVar11,1,5,false);
  module::SequentialModule::add(&moduleA,(Layer *)pFVar11);
  pLVar12 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(pLVar12,1,5,2,false);
  pLVar14 = (Layer *)((long)&pLVar12->_vptr_Loss + (long)pLVar12->_vptr_Loss[-3]);
  module::SequentialModule::add(&moduleA,pLVar14);
  module::SequentialModule::link(&moduleA,(char *)pLVar14,__to);
  module::SequentialModule::training(&moduleA,in,out,4,1.0);
  module::SequentialModule::SequentialModule(&moduleB);
  acceptableError_00._10_6_ = in_stack_fffffffffffffe62;
  acceptableError_00._0_10_ = (longdouble)0.001;
  module::SequentialModule::setStopParameter(&moduleB,1000,(scalar)acceptableError_00);
  learningRate_00._10_6_ = in_stack_fffffffffffffe62;
  learningRate_00._0_10_ = (longdouble)0.2;
  adaptiveLearningRate_00._10_6_ = in_stack_fffffffffffffe72;
  adaptiveLearningRate_00._0_10_ = (longdouble)1e-10;
  module::SequentialModule::setTrainingParameter
            (&moduleB,(scalar)learningRate_00,(scalar)adaptiveLearningRate_00);
  module::SequentialModule::setInput(&moduleB,2,1,1);
  pFVar11 = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(pFVar11,2,2,true);
  module::SequentialModule::add(&moduleB,(Layer *)pFVar11);
  pLVar12 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(pLVar12,1,2,2,true);
  pLVar14 = (Layer *)((long)&pLVar12->_vptr_Loss + (long)pLVar12->_vptr_Loss[-3]);
  module::SequentialModule::add(&moduleB,pLVar14);
  module::SequentialModule::link(&moduleB,(char *)pLVar14,__to_00);
  module::SequentialModule::training(&moduleB,in,out,4,1.0);
  poVar13 = std::operator<<((ostream *)&std::cout,"- Module A (ACTIVATION_GAUSSIAN): ");
  std::endl<char,std::char_traits<char>>(poVar13);
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    poVar13 = std::ostream::_M_insert<long_double>(***in[lVar15]);
    std::operator<<(poVar13," xor ");
    poVar13 = std::ostream::_M_insert<long_double>((**in[lVar15])[1]);
    poVar13 = std::operator<<(poVar13," => ");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::operator<<((ostream *)&std::cout,"   Out : ");
    ppplVar4 = module::SequentialModule::predict(&moduleA,in[lVar15]);
    poVar13 = std::ostream::_M_insert<long_double>(***ppplVar4);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::operator<<((ostream *)&std::cout,"   Layer  : ");
    ppplVar4 = layer::Layer::getPtrOut
                         (*moduleA._lLayers.
                           super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    poVar13 = std::ostream::_M_insert<long_double>(***ppplVar4);
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  poVar13 = std::operator<<((ostream *)&std::cout,"\n\n- Module B (ACTIVATION_SIGMOIDE): ");
  std::endl<char,std::char_traits<char>>(poVar13);
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    poVar13 = std::ostream::_M_insert<long_double>(***in[lVar15]);
    std::operator<<(poVar13," xor ");
    poVar13 = std::ostream::_M_insert<long_double>((**in[lVar15])[1]);
    poVar13 = std::operator<<(poVar13," => ");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::operator<<((ostream *)&std::cout,"   Out : ");
    ppplVar4 = module::SequentialModule::predict(&moduleB,in[lVar15]);
    poVar13 = std::ostream::_M_insert<long_double>(***ppplVar4);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::operator<<((ostream *)&std::cout,"   Layer  : ");
    ppplVar4 = layer::Layer::getPtrOut
                         (*moduleB._lLayers.
                           super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    poVar13 = std::ostream::_M_insert<long_double>(***ppplVar4);
    std::operator<<(poVar13,", ");
    ppplVar4 = layer::Layer::getPtrOut
                         (*moduleB._lLayers.
                           super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    poVar13 = std::ostream::_M_insert<long_double>((**ppplVar4)[1]);
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  module::SequentialModule::~SequentialModule(&moduleB);
  module::SequentialModule::~SequentialModule(&moduleA);
  return;
}

Assistant:

void learning_xor()
    {


        type::tensor in[4];
        in[0] = type::createTensor(2, 1, 1);
        in[1] = type::createTensor(2, 1, 1);
        in[2] = type::createTensor(2, 1, 1);
        in[3] = type::createTensor(2, 1, 1);

        type::tensor out[4];
        out[0] = type::createTensor(1, 1, 1);
        out[1] = type::createTensor(1, 1, 1);
        out[2] = type::createTensor(1, 1, 1);
        out[3] = type::createTensor(1, 1, 1);



        (**in[0])[0] = 0;
        (**in[0])[1] = 0;
        (***out[0]) = 0;

        (**in[1])[0] = 0;
        (**in[1])[1] = 1;
        (***out[1]) = 1;

        (**in[2])[0] = 1;
        (**in[2])[1] = 0;
        (***out[2]) = 1;

        (**in[3])[0] = 1;
        (**in[3])[1] = 1;
        (***out[3]) = 0;



        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule moduleA;
        moduleA.setStopParameter(100, 0.001);
        moduleA.setTrainingParameter(0.2, 0.0000000001);
        moduleA.setInput(2);
        moduleA.add(new layer::FullyConnected(1, ACTIVATION_GAUSSIAN, false));
        moduleA.add(new layer::Loss(1, ACTIVATION_GAUSSIAN, LOSS_LOGLOSS, false));
        moduleA.link();
        moduleA.training(in, out, 4, 1);

        function::tool::initRandTool(486446);
        module::SequentialModule moduleB;
        moduleB.setStopParameter(1000, 0.001);
        moduleB.setTrainingParameter(0.2, 0.0000000001);
        moduleB.setInput(2);
        moduleB.add(new layer::FullyConnected(2, ACTIVATION_SIGMOIDE, true));
        moduleB.add(new layer::Loss(1, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        moduleB.link();
        moduleB.training(in, out, 4, 1);


        std::cout << "- Module A (ACTIVATION_GAUSSIAN): " << std::endl;
        for(int i(0); i < 4 ; i++)
        {
            std::cout << in[i][0][0][0] << " xor " << in[i][0][0][1] << " => " << std::endl;
            std::cout << "   Out : " << ***moduleA.predict(in[i]) << std::endl;
            std::cout << "   Layer  : " << (**moduleA.getLayer(0)->getPtrOut())[0] << std::endl;
        }


        std::cout << "\n\n- Module B (ACTIVATION_SIGMOIDE): " << std::endl;
        for(int i(0); i < 4 ; i++)
        {
            std::cout << in[i][0][0][0] << " xor " << in[i][0][0][1] << " => " << std::endl;
            std::cout << "   Out : " << ***moduleB.predict(in[i]) << std::endl;
            std::cout << "   Layer  : "
            << (**moduleB.getLayer(0)->getPtrOut())[0] << ", "
            << (**moduleB.getLayer(0)->getPtrOut())[1] << std::endl;
        }
    }